

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusRcInAlpha::is_valid_val(MthdCelsiusRcInAlpha *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)(this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = uVar2 << 0x3c;
  if ((uint)(uVar3 >> 0x3d) < 7) {
    lVar1 = 0x34;
    bVar5 = false;
    uVar4 = 0;
    do {
      if ((uVar3 & 0xe000000000000000) == 0xa000000000000000) {
        return bVar5;
      }
      if ((uVar3 & 0xe000000000000000) == 0x6000000000000000) {
        return bVar5;
      }
      bVar5 = 2 < uVar4;
      if (lVar1 == 0x1c) {
        return bVar5;
      }
      uVar3 = uVar2 << ((byte)lVar1 & 0x3f);
      lVar1 = lVar1 + -8;
      uVar4 = uVar4 + 1;
    } while (uVar3 < 0xe000000000000000);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool is_valid_val() override {
		for (int j = 0; j < 4; j++) {
			int reg = extr(val, 8 * j, 4);
			if (reg == 6 || reg == 7 || reg == 0xa || reg == 0xb || reg >= 0xe)
				return false;
		}
		return true;
	}